

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::
Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
::Matcher(Matcher<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
          *this,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *value)

{
  pointer pcVar1;
  int iVar2;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  int local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  int local_50;
  MatcherBase<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
  local_48;
  
  (this->
  super_MatcherBase<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
  ).vtable_ = (VTable *)0x0;
  (this->
  super_MatcherBase<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
  ).buffer_.ptr = (void *)0x0;
  (this->
  super_MatcherBase<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_003474f8;
  pcVar1 = (value->first)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (value->first)._M_string_length);
  local_50 = value->second;
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_70,local_68 + (long)local_70);
  iVar2 = local_50;
  local_78 = local_50;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00347568;
  local_48.buffer_.ptr = (void *)0x0;
  local_48.vtable_ =
       (VTable *)
       internal::MatcherBase<std::pair<std::__cxx11::string,int>const&>::
       GetVTable<testing::internal::MatcherBase<std::pair<std::__cxx11::string,int>const&>::ValuePolicy<testing::internal::EqMatcher<std::pair<std::__cxx11::string,int>>,false>>()
       ::kVTable_abi_cxx11_;
  local_48.buffer_.ptr = operator_new(0x30);
  ((local_48.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_48.buffer_.i + 8) = (undefined8 *)(local_48.buffer_.i + 0x18);
  if (local_98 == &local_88) {
    *(undefined8 *)(local_48.buffer_.i + 0x18) = CONCAT71(uStack_87,local_88);
    *(undefined8 *)(local_48.buffer_.i + 0x20) = uStack_80;
  }
  else {
    *(undefined1 **)(local_48.buffer_.i + 8) = local_98;
    *(ulong *)(local_48.buffer_.i + 0x18) = CONCAT71(uStack_87,local_88);
  }
  *(undefined8 *)(local_48.buffer_.i + 0x10) = local_90;
  local_90 = 0;
  local_88 = 0;
  *(int *)(local_48.buffer_.i + 0x28) = iVar2;
  local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_003474f8;
  local_98 = &local_88;
  internal::
  MatcherBase<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
  ::operator=(&this->
               super_MatcherBase<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
              ,&local_48);
  internal::
  MatcherBase<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&>
  ::~MatcherBase(&local_48);
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}